

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvs.c
# Opt level: O2

LispPTR values(int arg_count,LispPTR *args)

{
  byte bVar1;
  FX2 *pFVar2;
  ByteCode *pBVar3;
  uint uVar4;
  LispPTR LVar5;
  FX2 *frame;
  fnhead *pfVar6;
  fnhead *pfVar7;
  FX2 *pFVar8;
  ByteCode *pBVar9;
  int unbind_count;
  FX2 *local_38;
  
  pFVar8 = (FX2 *)(MachineState.pvar + -10);
  local_38 = (FX2 *)0x0;
  unbind_count = 0;
  pFVar2 = pFVar8;
LAB_001280a8:
  frame = pFVar2;
  if (frame == pFVar8) {
    pBVar9 = MachineState.currentpc + 3;
    pfVar6 = MachineState.currentfunc;
    goto LAB_001280e0;
  }
  pfVar6 = (fnhead *)NativeAligned4FromLAddr(frame->fnheader & 0xfffffff);
  pBVar9 = (ByteCode *)(ulong)frame->pc;
  pfVar7 = pfVar6;
LAB_0012816e:
  do {
    pBVar9 = pBVar9 + (long)pfVar7;
LAB_001280e0:
    for (; bVar1 = *(byte *)((ulong)pBVar9 ^ 3), bVar1 != 0xb0; pBVar9 = pBVar9 + 1) {
      if (bVar1 == 0xb1) {
        bVar1 = *(byte *)((ulong)(pBVar9 + 1) ^ 3);
        uVar4 = (uint)bVar1 * 0x100 + -0x10000 + (uint)*(byte *)((ulong)(pBVar9 + 2) ^ 3);
        if (-1 < (char)bVar1) {
          uVar4 = (uint)CONCAT11(bVar1,*(byte *)((ulong)(pBVar9 + 2) ^ 3));
        }
        pfVar7 = (fnhead *)(long)(int)uVar4;
        goto LAB_0012816e;
      }
      if (bVar1 == 9) {
        if (MVLIST_index ==
            ((uint)*(byte *)((ulong)(pBVar9 + 4) ^ 3) |
            (uint)*(byte *)((ulong)(pBVar9 + 3) ^ 3) << 8 |
            (uint)*(byte *)((ulong)(pBVar9 + 2) ^ 3) << 0x10 |
            (uint)*(byte *)((ulong)(pBVar9 + 1) ^ 3) << 0x18)) {
          if (0 < unbind_count) {
            simulate_unbind(frame,unbind_count,local_38);
          }
          pBVar3 = pBVar9 + 2;
          if (frame != pFVar8) {
            frame->pc = ((short)pBVar9 - (short)pfVar6) + 5;
            pBVar3 = MachineState.currentpc;
          }
          MachineState.currentpc = pBVar3;
          LVar5 = make_value_list(arg_count,args);
          return LVar5;
        }
LAB_00128205:
        if (arg_count < 1) {
          LVar5 = 0;
        }
        else {
          LVar5 = *args;
        }
        return LVar5;
      }
      if (bVar1 == 0x3f) {
LAB_00128176:
        pFVar2 = (FX2 *)(Stackspace +
                        (*(ushort *)((long)&frame->alink + (ulong)((*(uint *)frame & 1) << 4)) - 10)
                        );
        local_38 = frame;
        goto LAB_001280a8;
      }
      if (bVar1 != 0x12) {
        if (bVar1 == 0x10) goto LAB_00128176;
        if (-0x71 < (char)bVar1) goto LAB_00128205;
        pfVar7 = (fnhead *)(ulong)(bVar1 + 2 & 0x1f);
        goto LAB_0012816e;
      }
      unbind_count = unbind_count + 1;
    }
    bVar1 = *(byte *)((ulong)(pBVar9 + 1) ^ 3);
    pfVar7 = (fnhead *)(ulong)bVar1 + -0x10;
    if (-1 < (char)bVar1) {
      pfVar7 = (fnhead *)(ulong)bVar1;
    }
  } while( true );
}

Assistant:

LispPTR values(int arg_count, LispPTR *args) {
  FX2 *caller, *prevcaller = 0, *immediate_caller = 0;
  ByteCode *pc;
  int unbind_count = 0;
  struct fnhead *fnhead;
  short opcode;

  caller = (FX2 *)CURRENTFX;
  immediate_caller = caller;

newframe:
  if (caller == immediate_caller) {
    fnhead = (struct fnhead *)FuncObj;
    pc = (ByteCode *)PC + 3; /* to skip the miscn opcode we're in now */
  } else {
    fnhead = (struct fnhead *)NativeAligned4FromLAddr(POINTERMASK & SWA_FNHEAD((int)caller->fnheader));
    pc = (ByteCode *)fnhead + (caller->pc);
  }
#ifdef RESWAPPEDCODESTREAM
  if (!fnhead->byteswapped) {
    byte_swap_code_block(fnhead);
    fnhead->byteswapped = 1;
  }
#endif /* RESWAPPEDCODESTREAM */

newpc:
  opcode = (short)((unsigned char)GETBYTE((char *)pc));
  switch (opcode) {
    case opc_RETURN:
    case opc_SLRETURN:
      prevcaller = caller;
      caller = (FX2 *)(Stackspace + (unsigned)(GETCLINK(caller)));
      goto newframe;

    case opc_FN1:
      if (MVLIST_index == Get_code_AtomNo(pc + 1)) {
        if (unbind_count > 0) simulate_unbind(caller, unbind_count, prevcaller);
#ifndef BIGATOMS
        /* would add 3 to  PC, but miscn return code does.*/
        if (caller == immediate_caller) PC = pc;
#else
        /* BUT 3's not enough for big atoms, so add diff between FN op size & MISCN op size */
        if (caller == immediate_caller) PC = pc + (FN_OPCODE_SIZE - 3);
#endif /* BIGATOMS */

        else
          caller->pc = (UNSIGNED)pc + FN_OPCODE_SIZE - (UNSIGNED)fnhead;
        return (make_value_list(arg_count, args));
      }
      break;

    case opc_UNBIND:
      pc += 1;
      unbind_count += 1;
      goto newpc;

    case opc_JUMPX: {
      short displacement;
      displacement = (short)(GETBYTE((char *)pc + 1));
      if (displacement >= 128) displacement -= 256;
      pc += displacement;
      goto newpc;
    }

    case opc_JUMPXX: {
      int displacement;
      displacement = (int)Get_code_DLword(pc + 1);
      if (displacement >= 32768) displacement -= 65536;
      pc += displacement;
      goto newpc;
    }
    default:
      if ((opcode >= opc_JUMP) && (opcode < opc_FJUMP)) {
        pc += 2 + opcode - opc_JUMP;
        goto newpc;
      }
  }

  /*****************************************/
  /* Default case:  Return a single value. */
  /*****************************************/

  if (arg_count > 0)
    return (args[0]);
  else
    return (NIL_PTR);
}